

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_response.cc
# Opt level: O2

void __thiscall RemoveResponse::RemoveResponse(RemoveResponse *this)

{
  FileInfo *pFVar1;
  
  NamenodeResponse::NamenodeResponse(&this->super_NamenodeResponse);
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_0013ba98;
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  std::__shared_ptr<FileInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileInfo,void>
            ((__shared_ptr<FileInfo,(__gnu_cxx::_Lock_policy)2> *)&this->file_info_,pFVar1);
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  std::__shared_ptr<FileInfo,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileInfo,void>
            ((__shared_ptr<FileInfo,(__gnu_cxx::_Lock_policy)2> *)&this->parent_info_,pFVar1);
  return;
}

Assistant:

RemoveResponse::RemoveResponse()
    : NamenodeResponse(), file_info_(new FileInfo()),
      parent_info_(new FileInfo()) {}